

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O0

void __thiscall cali::Caliper::end(Caliper *this,Attribute *attr)

{
  bool bVar1;
  uint prop_00;
  uint uVar2;
  cali_id_t attr_id;
  vector<cali::Channel,_std::allocator<cali::Channel>_> *this_00;
  element_type *peVar3;
  Variant VVar4;
  lock_guard<std::mutex> local_130;
  lock_guard<std::mutex> gbb_1;
  ChannelBody *local_118;
  Caliper *local_110;
  __shared_ptr_access<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_108;
  Channel *channel;
  iterator __end2;
  iterator __begin2;
  vector<cali::Channel,_std::allocator<cali::Channel>_> *__range2;
  BlackboardEntry local_e0;
  lock_guard<std::mutex> local_b0;
  lock_guard<std::mutex> gbb;
  BlackboardEntry local_98;
  lock_guard<(anonymous_namespace)::siglock> local_68;
  lock_guard<(anonymous_namespace)::siglock> g;
  BlackboardEntry current;
  cali_id_t key;
  bool run_events;
  int scope;
  int prop;
  Attribute *attr_local;
  Caliper *this_local;
  
  if ((this->sT->stack_error & 1U) != 0) {
    return;
  }
  prop_00 = Attribute::properties(attr);
  uVar2 = prop_00 & 0x3c;
  attr_id = Attribute::id(attr);
  current.entry.m_value.m_v.value.v_uint =
       anon_unknown.dwarf_30b7b8::get_blackboard_key(attr_id,prop_00);
  Entry::Entry((Entry *)&g);
  Entry::Entry((Entry *)&current.merged_entry.m_value.m_v.value);
  std::lock_guard<(anonymous_namespace)::siglock>::lock_guard(&local_68,&this->sT->lock);
  if (uVar2 == 0x14) {
    anon_unknown.dwarf_30b7b8::load_current_entry
              (&local_98,attr,current.entry.m_value.m_v.value.v_uint,&this->sT->thread_blackboard);
    memcpy(&g,&local_98,0x30);
  }
  else {
    if (uVar2 != 0xc) goto LAB_003f03ef;
    std::lock_guard<std::mutex>::lock_guard(&local_b0,&this->sG->process_blackboard_lock);
    anon_unknown.dwarf_30b7b8::load_current_entry
              (&local_e0,attr,current.entry.m_value.m_v.value.v_uint,&this->sG->process_blackboard);
    memcpy(&g,&local_e0,0x30);
    std::lock_guard<std::mutex>::~lock_guard(&local_b0);
  }
  bVar1 = Entry::empty((Entry *)&current.merged_entry.m_value.m_v.value);
  if (bVar1) {
    this->sT->stack_error = true;
  }
  else {
    if ((prop_00 & 0x40) == 0) {
      this_00 = &this->sG->active_channels;
      __end2 = std::vector<cali::Channel,_std::allocator<cali::Channel>_>::begin(this_00);
      channel = (Channel *)std::vector<cali::Channel,_std::allocator<cali::Channel>_>::end(this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<cali::Channel_*,_std::vector<cali::Channel,_std::allocator<cali::Channel>_>_>
                                         *)&channel), bVar1) {
        local_108 = (__shared_ptr_access<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)__gnu_cxx::
                       __normal_iterator<cali::Channel_*,_std::vector<cali::Channel,_std::allocator<cali::Channel>_>_>
                       ::operator*(&__end2);
        peVar3 = std::
                 __shared_ptr_access<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(local_108);
        local_110 = this;
        local_118 = Channel::body((Channel *)local_108);
        VVar4 = Entry::value((Entry *)&current.merged_entry.m_value.m_v.value);
        gbb_1._M_device = (mutex_type *)VVar4.m_v.type_and_size;
        util::
        callback<void(cali::Caliper*,cali::ChannelBody*,cali::Attribute_const&,cali::Variant_const&)>
        ::operator()((callback<void(cali::Caliper*,cali::ChannelBody*,cali::Attribute_const&,cali::Variant_const&)>
                      *)&(peVar3->events).pre_end_evt,&local_110,&local_118,attr,(Variant *)&gbb_1);
        __gnu_cxx::
        __normal_iterator<cali::Channel_*,_std::vector<cali::Channel,_std::allocator<cali::Channel>_>_>
        ::operator++(&__end2);
      }
    }
    if (uVar2 == 0x14) {
      anon_unknown.dwarf_30b7b8::handle_end
                (attr,prop_00,(BlackboardEntry *)&g,current.entry.m_value.m_v.value.v_uint,
                 &this->sT->thread_blackboard,&this->sT->tree);
    }
    else {
      std::lock_guard<std::mutex>::lock_guard(&local_130,&this->sG->process_blackboard_lock);
      anon_unknown.dwarf_30b7b8::handle_end
                (attr,prop_00,(BlackboardEntry *)&g,current.entry.m_value.m_v.value.v_uint,
                 &this->sG->process_blackboard,&this->sT->tree);
      std::lock_guard<std::mutex>::~lock_guard(&local_130);
    }
  }
LAB_003f03ef:
  std::lock_guard<(anonymous_namespace)::siglock>::~lock_guard(&local_68);
  return;
}

Assistant:

void Caliper::end(const Attribute& attr)
{
    if (sT->stack_error)
        return;

    int prop  = attr.properties();
    int scope = prop & CALI_ATTR_SCOPE_MASK;

    bool run_events = !(prop & CALI_ATTR_SKIP_EVENTS);

    cali_id_t   key         = get_blackboard_key(attr.id(), prop);
    BlackboardEntry current = { Entry(), Entry( ) };

    std::lock_guard<::siglock> g(sT->lock);

    if (scope == CALI_ATTR_SCOPE_THREAD)
        current = load_current_entry(attr, key, sT->thread_blackboard);
    else if (scope == CALI_ATTR_SCOPE_PROCESS) {
        std::lock_guard<std::mutex> gbb(sG->process_blackboard_lock);
        current = load_current_entry(attr, key, sG->process_blackboard);
    } else
        return;

    if (current.entry.empty()) {
        sT->stack_error = true;
        return;
    }

    // invoke callbacks
    if (run_events)
        for (auto& channel : sG->active_channels)
            channel.mP->events.pre_end_evt(this, channel.body(), attr, current.entry.value());

    if (scope == CALI_ATTR_SCOPE_THREAD)
        handle_end(attr, prop, current, key, sT->thread_blackboard, sT->tree);
    else {
        std::lock_guard<std::mutex> gbb(sG->process_blackboard_lock);
        handle_end(attr, prop, current, key, sG->process_blackboard, sT->tree);
    }
}